

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O2

void __thiscall
Init::TextDocumentSyncOptions::TextDocumentSyncOptions(TextDocumentSyncOptions *this)

{
  (this->super_Reflectable)._vptr_Reflectable = (_func_int **)&PTR_reflect_002035c0;
  this->openClose = false;
  this->change = None;
  this->willSave = false;
  this->willSaveWaitUntil = false;
  *(undefined8 *)&(this->save).value.includeText = 0;
  (this->save).value.super_Reflectable._vptr_Reflectable = (_func_int **)&PTR_reflect_002035f0;
  (this->save).is_some = false;
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectBool(writer, "openClose", openClose);
            reflectInt(writer, "change", (int) change);
            reflectBool(writer, "willSave", willSave);
            reflectBool(writer, "willSaveWaitUntil", willSaveWaitUntil);
            reflectOptionalObject(writer, "save", save);
            writer.EndObject();
        }